

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

xmlChar * xmlStrcat(xmlChar *cur,xmlChar *add)

{
  xmlChar *pxVar1;
  long lVar2;
  xmlChar *p;
  
  if (add == (xmlChar *)0x0) {
    return cur;
  }
  if (cur != (xmlChar *)0x0) {
    lVar2 = 0;
    do {
      pxVar1 = add + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pxVar1 != '\0');
    pxVar1 = xmlStrncat(cur,add,(int)lVar2 + -1);
    return pxVar1;
  }
  lVar2 = 0;
  do {
    pxVar1 = add + lVar2;
    lVar2 = lVar2 + 1;
  } while (*pxVar1 != '\0');
  pxVar1 = xmlStrndup(add,(int)lVar2 + -1);
  return pxVar1;
}

Assistant:

xmlChar *
xmlStrcat(xmlChar *cur, const xmlChar *add) {
    const xmlChar *p = add;

    if (add == NULL) return(cur);
    if (cur == NULL)
        return(xmlStrdup(add));

    while (*p != 0) p++; /* non input consuming */
    return(xmlStrncat(cur, add, p - add));
}